

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress_bar.h
# Opt level: O0

void __thiscall OutputBox::Cerror(OutputBox *this,string *err,string *title)

{
  bool bVar1;
  string local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [55];
  allocator local_41;
  string local_40 [8];
  string complete_err;
  string *title_local;
  string *err_local;
  OutputBox *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  bVar1 = std::operator!=(title,"");
  if (bVar1) {
    std::operator+(local_78,(char *)title);
    PrintData(this,local_78);
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::operator=(local_40," ");
  }
  std::operator+((char *)local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" ERROR: [");
  std::operator+(local_98,(char *)local_b8);
  std::__cxx11::string::operator+=(local_40,(string *)local_98);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string(local_b8);
  PrintData(this,(string *)local_40);
  PrintSeparatorLine(this);
  exit(1);
}

Assistant:

void Cerror(const std::string& err, const std::string& title = "")
    {
        std::string complete_err = "";
        if (title != "") {
            PrintData(title + ":");
            complete_err = " ";
        }
        complete_err += " ERROR: [" + err + "]";
        PrintData(complete_err);
        PrintSeparatorLine();
        exit(EXIT_FAILURE);

        /*

        If the title is specified this function will print:

        | title:                                                                     |
        |  ERROR: [err]                                                              |
        +----------------------------------------------------------------------------+

        otherwise:

        |  ERROR: [err]                                                              |
        +----------------------------------------------------------------------------+

        */
    }